

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ILogger *pIVar1;
  LogStdout *in_stack_ffffffffffffffe0;
  
  pIVar1 = (ILogger *)operator_new(8);
  liblogger::LogStdout::LogStdout(in_stack_ffffffffffffffe0);
  liblogger::LogManager::Add(pIVar1);
  examples();
  liblogger::LogManager::RemoveAll();
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
	LogManager::Add(new LogStdout());

	examples();

	LogManager::RemoveAll();
	return 0;
}